

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

vector<SingleElements,_std::allocator<SingleElements>_> * __thiscall
ZippedFile::GetInnerElements
          (vector<SingleElements,_std::allocator<SingleElements>_> *__return_storage_ptr__,
          ZippedFile *this,int type)

{
  bool bVar1;
  reference ppNVar2;
  __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_> local_48;
  __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_> local_40;
  iterator it;
  int nb_elements;
  int type_local;
  ZippedFile *this_local;
  vector<SingleElements,_std::allocator<SingleElements>_> *list;
  
  std::vector<SingleElements,_std::allocator<SingleElements>_>::vector(__return_storage_ptr__);
  (*(this->super_IContainedElement)._vptr_IContainedElement[3])();
  local_40._M_current =
       (NodeFS **)
       std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::begin(&(this->zip_file_).sub_node_);
  while( true ) {
    local_48._M_current =
         (NodeFS **)
         std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>::end(&(this->zip_file_).sub_node_);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    ppNVar2 = __gnu_cxx::
              __normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
              operator*(&local_40);
    NodeFS::AddElementsToList(*ppNVar2,__return_storage_ptr__,type);
    __gnu_cxx::__normal_iterator<NodeFS_**,_std::vector<NodeFS_*,_std::allocator<NodeFS_*>_>_>::
    operator++(&local_40,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleElements> ZippedFile::GetInnerElements(int type)
{
   std::vector<SingleElements> list;

   int nb_elements = GetNumberOfElements();
   for (std::vector<NodeFS*>::iterator it = zip_file_.sub_node_.begin(); it != zip_file_.sub_node_.end(); it++)
   {
      (*it)->AddElementsToList(list, type);
   }

   return list;
}